

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

void __thiscall
xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::
AddEdge(Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
        *this,StateExample *sstate,StateExample *dstate,double trans)

{
  bool bVar1;
  const_vertex_iterator this_00;
  edge_iterator this_01;
  edge_iterator __args;
  pointer pEVar2;
  ostream *poVar3;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_false>
  this_02;
  value_type *in_RDI;
  double in_XMM0_Qa;
  vertex_iterator dst_vertex;
  StateExample *in_stack_00000020;
  edge_iterator it;
  vertex_iterator src_vertex;
  Vertex *in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffd0;
  
  this_00.super_VertexMapTypeIterator.
  super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_false>
  ._M_cur = (VertexMapTypeIterator)
            ObtainVertexFromVertexMap
                      ((Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
                        *)it._M_node,in_stack_00000020);
  vertex_iterator::operator->((vertex_iterator *)0x1055cc);
  this_01 = Vertex::FindEdge<xmotion::StateExample_*,_nullptr>
                      ((Vertex *)
                       this_00.super_VertexMapTypeIterator.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Vertex_*>,_false>
                       ._M_cur,in_stack_ffffffffffffffd0._M_node);
  vertex_iterator::operator->((vertex_iterator *)0x1055e8);
  __args = Vertex::edge_end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8);
  if (bVar1) {
    pEVar2 = std::
             _List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
             ::operator->((_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
                           *)0x105620);
    pEVar2->cost = in_XMM0_Qa;
    poVar3 = std::operator<<((ostream *)&std::cout,"updated cost: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_XMM0_Qa);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    this_02._M_cur =
         (__node_type *)
         ObtainVertexFromVertexMap
                   ((Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
                     *)it._M_node,in_stack_00000020);
    vertex_iterator::operator->((vertex_iterator *)0x10567b);
    std::__cxx11::
    list<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::vertex_iterator>_>
    ::push_back((list<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::vertex_iterator>_>
                 *)this_02._M_cur,in_RDI);
    vertex_iterator::operator->((vertex_iterator *)0x105696);
    std::__cxx11::
    list<xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Edge,std::allocator<xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::Edge>>
    ::
    emplace_back<xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::vertex_iterator&,xmotion::Graph<xmotion::StateExample*,double,xmotion::DefaultIndexer<xmotion::StateExample*>>::vertex_iterator&,double&>
              ((list<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge,_std::allocator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>
                *)this_01._M_node,(vertex_iterator *)__args._M_node,
               (vertex_iterator *)this_02._M_cur,(double *)in_RDI);
  }
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}